

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O1

void add_shader_program(GLuint p_id,vector<unsigned_int,_std::allocator<unsigned_int>_> *p_shaders)

{
  ShaderProgram local_48;
  GLuint local_30;
  pointer local_28;
  pointer local_20;
  pointer puStack_18;
  
  ShaderProgram::ShaderProgram(&local_48,p_shaders);
  local_28 = local_48.m_shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_20 = local_48.m_shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  puStack_18 = local_48.m_shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.m_shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30 = p_id;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,ShaderProgram>,std::allocator<std::pair<unsigned_int_const,ShaderProgram>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_int,ShaderProgram>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,ShaderProgram>,std::allocator<std::pair<unsigned_int_const,ShaderProgram>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)ShaderDb::program_map);
  if (local_28 != (pointer)0x0) {
    operator_delete(local_28,(long)puStack_18 - (long)local_28);
  }
  if (local_48.m_shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.m_shaders.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.m_shaders.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.m_shaders.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void add_shader_program(
    const GLuint p_id,
    const std::vector<GLuint> &p_shaders) noexcept
{
    ShaderDb::program_map.emplace(
        std::make_pair(
            p_id,
            ShaderProgram(p_shaders)));
}